

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_XMLVariant * ParamHelper(ON_XMLVariant *__return_storage_ptr__,ON_XMLParameters *p,wchar_t *name)

{
  byte bVar1;
  ON_XMLVariant local_130;
  undefined1 local_21;
  wchar_t *local_20;
  wchar_t *name_local;
  ON_XMLParameters *p_local;
  ON_XMLVariant *value;
  
  local_21 = 0;
  local_20 = name;
  name_local = (wchar_t *)p;
  p_local = (ON_XMLParameters *)__return_storage_ptr__;
  ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  bVar1 = (**(code **)(*(long *)name_local + 0x30))(name_local,local_20,__return_storage_ptr__);
  if ((bVar1 & 1) == 0) {
    ON_XMLVariant::ON_XMLVariant(&local_130,L"");
    ON_XMLVariant::operator=(__return_storage_ptr__,&local_130);
    ON_XMLVariant::~ON_XMLVariant(&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ParamHelper(const ON_XMLParameters& p, const wchar_t* name)
{
  ON_XMLVariant value;
  if (!p.GetParam(name, value))
    value = L"";

  return value;
}